

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Maybe<kj::Promise<unsigned_long>_> __thiscall
kj::AsyncIoStreamWithGuards::tryPumpFrom
          (AsyncIoStreamWithGuards *this,AsyncInputStream *input,uint64_t amount)

{
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX;
  anon_class_24_3_e7c12ea1_for_func *this_00;
  Maybe<kj::Promise<unsigned_long>_> MVar1;
  anon_class_24_3_e7c12ea1_for_func local_50;
  uint64_t local_38;
  
  if (*(char *)((long)&input[9]._vptr_AsyncInputStream + 1) == '\x01') {
    this_00 = (anon_class_24_3_e7c12ea1_for_func *)&local_50.amount;
    (**(code **)(*(long *)amount + 0x18))(this_00,amount,input[4]._vptr_AsyncInputStream + 1);
    *(undefined1 *)&(this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream = 1;
    (this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream =
         (_func_int **)local_50.amount;
    local_50.amount = 0;
  }
  else {
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)&local_50);
    local_50.amount = (uint64_t)input;
    local_38 = amount;
    Promise<void>::
    then<kj::AsyncIoStreamWithGuards::tryPumpFrom(kj::AsyncInputStream&,unsigned_long)::_lambda()_1_>
              ((Promise<void> *)&local_50.input,&local_50);
    *(undefined1 *)&(this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream = 1;
    (this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream =
         (_func_int **)local_50.input;
    local_50.input = (AsyncInputStream *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_50.input);
    this_00 = &local_50;
  }
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_00);
  MVar1.ptr.field_1 = extraout_RDX;
  MVar1.ptr._0_8_ = this;
  return (Maybe<kj::Promise<unsigned_long>_>)MVar1.ptr;
}

Assistant:

kj::Maybe<kj::Promise<uint64_t>> tryPumpFrom(AsyncInputStream& input,
                                               uint64_t amount = kj::maxValue) override {
    if (writeGuardReleased) {
      return input.pumpTo(*inner, amount);
    } else {
      return writeGuard.addBranch().then([this,&input,amount]() {
        return input.pumpTo(*inner, amount);
      });
    }
  }